

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void LodePNGIText_cleanup(LodePNGInfo *info)

{
  char **ppcVar1;
  size_t sVar2;
  
  if (info->itext_num != 0) {
    sVar2 = 0;
    do {
      ppcVar1 = info->itext_keys;
      free(ppcVar1[sVar2]);
      ppcVar1[sVar2] = (char *)0x0;
      ppcVar1 = info->itext_langtags;
      free(ppcVar1[sVar2]);
      ppcVar1[sVar2] = (char *)0x0;
      ppcVar1 = info->itext_transkeys;
      free(ppcVar1[sVar2]);
      ppcVar1[sVar2] = (char *)0x0;
      ppcVar1 = info->itext_strings;
      free(ppcVar1[sVar2]);
      ppcVar1[sVar2] = (char *)0x0;
      sVar2 = sVar2 + 1;
    } while (sVar2 != info->itext_num);
  }
  free(info->itext_keys);
  free(info->itext_langtags);
  free(info->itext_transkeys);
  free(info->itext_strings);
  return;
}

Assistant:

static void LodePNGIText_cleanup(LodePNGInfo* info)
{
	size_t i;
	for (i = 0; i != info->itext_num; ++i)
	{
		string_cleanup(&info->itext_keys[i]);
		string_cleanup(&info->itext_langtags[i]);
		string_cleanup(&info->itext_transkeys[i]);
		string_cleanup(&info->itext_strings[i]);
	}
	lodepng_free(info->itext_keys);
	lodepng_free(info->itext_langtags);
	lodepng_free(info->itext_transkeys);
	lodepng_free(info->itext_strings);
}